

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_counter_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c0738::DebugCounterTest_MacroProvidesReportAtExitDependingOnBuild_Test::TestBody
          (DebugCounterTest_MacroProvidesReportAtExitDependingOnBuild_Test *this)

{
  pointer pDVar1;
  bool bVar2;
  int iVar3;
  char *message;
  bool expect_output;
  AssertHelper local_d0;
  Message local_c8;
  int local_bc;
  exception *gtest_exception;
  int local_88;
  NoopDebugCounter local_81;
  int i_1;
  NoopDebugCounter local_79;
  int i;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  local_68;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_50;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_38;
  pointer local_20;
  DeathTest *gtest_dt;
  DebugCounterTest_MacroProvidesReportAtExitDependingOnBuild_Test *pDStack_10;
  bool match_output;
  DebugCounterTest_MacroProvidesReportAtExitDependingOnBuild_Test *this_local;
  
  gtest_dt._7_1_ = 0;
  pDStack_10 = this;
  bVar2 = testing::internal::AlwaysTrue();
  if (!bVar2) goto LAB_005492cb;
  ::(anonymous_namespace)::MatchOutput_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)0x0,expect_output);
  testing::internal::MakeDeathTestMatcher(&local_38,&local_50);
  bVar2 = testing::internal::DeathTest::Create
                    ("{ ::google::protobuf::internal::NoopDebugCounter {}.Inc(); for (int i = 0; i < 2; ++i) { ::google::protobuf::internal::NoopDebugCounter {}.Inc(); } for (int i = 0; i < 3; ++i) { ::google::protobuf::internal::NoopDebugCounter {}.Inc(); } ::google::protobuf::internal::NoopDebugCounter {}.Inc(); exit(0); }"
                     ,&local_38,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/debug_counter_test.cc"
                     ,0x62,&local_20);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_38);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_50);
  if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_005492cb;
  if (local_20 == (pointer)0x0) {
    return;
  }
  std::unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
  unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
            ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
              *)&local_68,local_20);
  iVar3 = (*local_20->_vptr_DeathTest[2])();
  pDVar1 = local_20;
  if (iVar3 == 0) {
    testing::ExitedWithCode::ExitedWithCode((ExitedWithCode *)((long)&gtest_sentinel.test_ + 4),0);
    iVar3 = (*local_20->_vptr_DeathTest[3])();
    bVar2 = testing::ExitedWithCode::operator()
                      ((ExitedWithCode *)((long)&gtest_sentinel.test_ + 4),iVar3);
    iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
    if ((((byte)iVar3 ^ 0xff) & 1) == 0) goto LAB_00549293;
    local_bc = 2;
  }
  else {
    if (iVar3 == 1) {
      testing::internal::DeathTest::ReturnSentinel::ReturnSentinel((ReturnSentinel *)&i,local_20);
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        google::protobuf::internal::NoopDebugCounter::Inc(&local_79);
        for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
          google::protobuf::internal::NoopDebugCounter::Inc(&local_81);
        }
        for (local_88 = 0; local_88 < 3; local_88 = local_88 + 1) {
          google::protobuf::internal::NoopDebugCounter::Inc
                    ((NoopDebugCounter *)((long)&gtest_exception + 7));
        }
        google::protobuf::internal::NoopDebugCounter::Inc
                  ((NoopDebugCounter *)((long)&gtest_exception + 6));
        exit(0);
      }
      (*local_20->_vptr_DeathTest[5])(local_20,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel((ReturnSentinel *)&i);
    }
LAB_00549293:
    local_bc = 0;
  }
  std::unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  ::~unique_ptr(&local_68);
  if (local_bc == 0) {
    return;
  }
LAB_005492cb:
  testing::Message::Message(&local_c8);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/debug_counter_test.cc"
             ,0x62,message);
  testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  testing::Message::~Message(&local_c8);
  return;
}

Assistant:

TEST(DebugCounterTest, MacroProvidesReportAtExitDependingOnBuild) {
#if defined(PROTOBUF_INTERNAL_ENABLE_DEBUG_COUNTERS)
  constexpr bool match_output = true;
#else
  constexpr bool match_output = false;

  // and test that the operations have no side effects.
  static_assert((PROTOBUF_DEBUG_COUNTER("Foo.Bar").Inc(), true), "");
#endif

  EXPECT_EXIT(
      {
        PROTOBUF_DEBUG_COUNTER("Foo.Bar").Inc();
        for (int i = 0; i < 2; ++i) {
          PROTOBUF_DEBUG_COUNTER("Foo.Baz").Inc();
        }
        for (int i = 0; i < 3; ++i) {
          PROTOBUF_DEBUG_COUNTER("Num.32").Inc();
        }
        PROTOBUF_DEBUG_COUNTER("Num.128").Inc();
        exit(0);
      },
      ExitedWithCode(0), MatchOutput(match_output));
}